

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.cpp
# Opt level: O2

void __thiscall
wasm::ModuleUtils::getOptimizedIndexedHeapTypes(wasm::Module&)::GroupInfoMap::sort(std::vector<wasm
::RecGroup,std::allocator<wasm::RecGroup>_>__
          (void *this,vector<wasm::RecGroup,_std::allocator<wasm::RecGroup>_> *groups)

{
  __normal_iterator<wasm::RecGroup_*,_std::vector<wasm::RecGroup,_std::allocator<wasm::RecGroup>_>_>
  __first;
  __normal_iterator<wasm::RecGroup_*,_std::vector<wasm::RecGroup,_std::allocator<wasm::RecGroup>_>_>
  __last;
  long lVar1;
  ulong uVar2;
  __normal_iterator<wasm::RecGroup_*,_std::vector<wasm::RecGroup,_std::allocator<wasm::RecGroup>_>_>
  __i;
  __normal_iterator<wasm::RecGroup_*,_std::vector<wasm::RecGroup,_std::allocator<wasm::RecGroup>_>_>
  __last_00;
  
  __first._M_current =
       (groups->super__Vector_base<wasm::RecGroup,_std::allocator<wasm::RecGroup>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (groups->super__Vector_base<wasm::RecGroup,_std::allocator<wasm::RecGroup>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar2 = (long)__last._M_current - (long)__first._M_current >> 3;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<wasm::RecGroup*,std::vector<wasm::RecGroup,std::allocator<wasm::RecGroup>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wasm::ModuleUtils::getOptimizedIndexedHeapTypes(wasm::Module&)::GroupInfoMap::sort(std::vector<wasm::RecGroup,std::allocator<wasm::RecGroup>>&)::_lambda(auto:1&,auto:2&)_1_>>
              (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_ir_module_utils_cpp:373:47)>
                )this);
    if ((long)__last._M_current - (long)__first._M_current < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<wasm::RecGroup*,std::vector<wasm::RecGroup,std::allocator<wasm::RecGroup>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::ModuleUtils::getOptimizedIndexedHeapTypes(wasm::Module&)::GroupInfoMap::sort(std::vector<wasm::RecGroup,std::allocator<wasm::RecGroup>>&)::_lambda(auto:1&,auto:2&)_1_>>
                (__first,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_ir_module_utils_cpp:373:47)>
                  )this);
      return;
    }
    __last_00._M_current = __first._M_current + 0x10;
    std::
    __insertion_sort<__gnu_cxx::__normal_iterator<wasm::RecGroup*,std::vector<wasm::RecGroup,std::allocator<wasm::RecGroup>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::ModuleUtils::getOptimizedIndexedHeapTypes(wasm::Module&)::GroupInfoMap::sort(std::vector<wasm::RecGroup,std::allocator<wasm::RecGroup>>&)::_lambda(auto:1&,auto:2&)_1_>>
              (__first,__last_00,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_ir_module_utils_cpp:373:47)>
                )this);
    for (; __last_00._M_current != __last._M_current;
        __last_00._M_current = __last_00._M_current + 1) {
      std::
      __unguarded_linear_insert<__gnu_cxx::__normal_iterator<wasm::RecGroup*,std::vector<wasm::RecGroup,std::allocator<wasm::RecGroup>>>,__gnu_cxx::__ops::_Val_comp_iter<wasm::ModuleUtils::getOptimizedIndexedHeapTypes(wasm::Module&)::GroupInfoMap::sort(std::vector<wasm::RecGroup,std::allocator<wasm::RecGroup>>&)::_lambda(auto:1&,auto:2&)_1_>>
                (__last_00,
                 (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_ir_module_utils_cpp:373:47)>
                  )this);
    }
  }
  return;
}

Assistant:

void sort(std::vector<RecGroup>& groups) {
      std::sort(groups.begin(), groups.end(), [&](auto& a, auto& b) {
        return this->at(a) < this->at(b);
      });
    }